

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O3

void y4m_42xmpeg2_42xjpeg_helper(uchar *_dst,uchar *_src,int _c_w,int _c_h)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (0 < _c_h) {
    uVar2 = 2;
    if (_c_w < 2) {
      uVar2 = (ulong)(uint)_c_w;
    }
    lVar4 = (long)_c_w;
    uVar9 = _c_w - 3;
    iVar5 = 0;
    do {
      iVar8 = (int)(lVar4 + -1);
      uVar12 = 0;
      if (0 < _c_w) {
        uVar11 = 0;
        do {
          uVar1 = uVar11 + 1;
          iVar6 = iVar8;
          if ((int)uVar1 < iVar8) {
            iVar6 = (int)uVar1;
          }
          iVar7 = (int)uVar11 + 2;
          if (iVar8 <= iVar7) {
            iVar7 = iVar8;
          }
          iVar3 = (int)uVar11 + 3;
          if (iVar8 <= iVar3) {
            iVar3 = iVar8;
          }
          iVar6 = (int)((((uint)_src[uVar11] * 0x72 + (uint)*_src * -0xd + (uint)_src[iVar6] * 0x23)
                        - ((uint)_src[iVar7] + (uint)_src[iVar7] * 8)) + (uint)_src[iVar3] + 0x40)
                  >> 7;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          _dst[uVar11] = (uchar)iVar6;
          uVar12 = uVar2;
          uVar11 = uVar1;
        } while (uVar2 != uVar1);
      }
      uVar10 = (uint)uVar12;
      if ((int)(uint)uVar12 < (int)uVar9) {
        do {
          iVar6 = (int)((((uint)_src[uVar12 + 1] * 0x23 +
                         (uint)_src[uVar12] * 0x72 +
                         ((uint)_src[uVar12 - 2] * 4 -
                         ((uint)_src[uVar12 - 1] * 0x10 + (uint)_src[uVar12 - 1]))) -
                        ((uint)_src[uVar12 + 2] + (uint)_src[uVar12 + 2] * 8)) +
                        (uint)_src[uVar12 + 3] + 0x40) >> 7;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          _dst[uVar12] = (uchar)iVar6;
          uVar12 = uVar12 + 1;
          uVar10 = uVar9;
        } while (uVar9 != uVar12);
      }
      if ((int)uVar10 < _c_w) {
        uVar12 = (ulong)uVar10;
        iVar6 = uVar10 + 2;
        do {
          iVar7 = iVar6 + -1;
          if (iVar8 <= iVar6 + -1) {
            iVar7 = iVar8;
          }
          iVar3 = iVar8;
          if (iVar6 < iVar8) {
            iVar3 = iVar6;
          }
          iVar7 = (int)((((uint)_src[uVar12 - 2] * 4 + (uint)_src[uVar12 - 1] * -0x11 +
                          (uint)_src[uVar12] * 0x72 + (uint)_src[iVar7] * 0x23) -
                        ((uint)_src[iVar3] + (uint)_src[iVar3] * 8)) + (uint)_src[lVar4 + -1] + 0x40
                       ) >> 7;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          _dst[uVar12] = (uchar)iVar7;
          uVar12 = uVar12 + 1;
          iVar6 = iVar6 + 1;
        } while ((uint)_c_w != uVar12);
      }
      _dst = _dst + lVar4;
      _src = _src + lVar4;
      iVar5 = iVar5 + 1;
    } while (iVar5 != _c_h);
  }
  return;
}

Assistant:

static void y4m_42xmpeg2_42xjpeg_helper(unsigned char *_dst,
                                        const unsigned char *_src, int _c_w,
                                        int _c_h) {
  int y;
  int x;
  for (y = 0; y < _c_h; y++) {
    /*Filter: [4 -17 114 35 -9 1]/128, derived from a 6-tap Lanczos
       window.*/
    for (x = 0; x < OC_MINI(_c_w, 2); x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[0] - 17 * _src[OC_MAXI(x - 1, 0)] + 114 * _src[x] +
           35 * _src[OC_MINI(x + 1, _c_w - 1)] -
           9 * _src[OC_MINI(x + 2, _c_w - 1)] + _src[OC_MINI(x + 3, _c_w - 1)] +
           64) >>
              7,
          255);
    }
    for (; x < _c_w - 3; x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[x - 2] - 17 * _src[x - 1] + 114 * _src[x] +
           35 * _src[x + 1] - 9 * _src[x + 2] + _src[x + 3] + 64) >>
              7,
          255);
    }
    for (; x < _c_w; x++) {
      _dst[x] = (unsigned char)OC_CLAMPI(
          0,
          (4 * _src[x - 2] - 17 * _src[x - 1] + 114 * _src[x] +
           35 * _src[OC_MINI(x + 1, _c_w - 1)] -
           9 * _src[OC_MINI(x + 2, _c_w - 1)] + _src[_c_w - 1] + 64) >>
              7,
          255);
    }
    _dst += _c_w;
    _src += _c_w;
  }
}